

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorHandling.h
# Opt level: O3

void phaeton::ph_unreachable_internal(char *msg,char *file,uint line)

{
  size_t sVar1;
  ostream *poVar2;
  
  if (msg != (char *)0x0) {
    sVar1 = strlen(msg);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,msg,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  }
  std::operator<<((ostream *)&std::cerr,"UNREACHABLE executed");
  poVar2 = std::operator<<((ostream *)&std::cerr," at ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/lijiansong[P]Phaeton/lib/Sema/Sema.cpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  std::ostream::operator<<(poVar2,(uint)file);
  std::operator<<((ostream *)&std::cerr,"!\n");
  abort();
}

Assistant:

PH_ATTRIBUTE_NORETURN static void
ph_unreachable_internal(const char *msg = nullptr, const char *file = nullptr,
                        unsigned line = 0) {
  if (msg)
    std::cerr << msg << "\n";
  std::cerr << "UNREACHABLE executed";
  if (file)
    std::cerr << " at " << file << ":" << line;
  std::cerr << "!\n";
  abort();
}